

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTexture.cpp
# Opt level: O2

void __thiscall
glu::TextureCube::loadCompressed
          (TextureCube *this,int numLevels,CompressedTexture *levels,
          TexDecompressionParams *decompressionParams)

{
  code *pcVar1;
  pointer puVar2;
  int iVar3;
  deUint32 dVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  ulong uVar7;
  TestError *this_00;
  ulong uVar8;
  vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *pvVar9;
  CompressedTexture *this_01;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  PixelBufferAccess refLevelAccess;
  long lVar6;
  
  iVar3 = (*this->m_context->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  dVar4 = getGLFormat(levels->m_format);
  if (this->m_glTexture == 0) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"m_glTexture",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
               ,0x19e);
LAB_008c64ff:
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(lVar6 + 0xb8))(0x8513);
  uVar7 = 0;
  uVar8 = (ulong)(uint)numLevels;
  if (numLevels < 1) {
    uVar8 = uVar7;
  }
  uVar10 = 0;
  do {
    if (uVar10 == uVar8) {
      dVar4 = (**(code **)(lVar6 + 0x800))();
      checkError(dVar4,"Texture upload failed",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
                 ,0x1b4);
      return;
    }
    pvVar9 = (this->m_refTexture).m_access;
    uVar12 = uVar7;
    for (lVar11 = 0; lVar11 != 6; lVar11 = lVar11 + 1) {
      tcu::TextureCube::allocLevel(&this->m_refTexture,(CubeFace)lVar11,(int)uVar10);
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                (&refLevelAccess.super_ConstPixelBufferAccess,
                 &(pvVar9->
                  super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                  )._M_impl.super__Vector_impl_data._M_start[uVar10].super_ConstPixelBufferAccess);
      if ((levels[(long)uVar12 >> 0x20].m_width !=
           refLevelAccess.super_ConstPixelBufferAccess.m_size.m_data[0]) ||
         (this_01 = levels + ((long)uVar12 >> 0x20),
         this_01->m_height != refLevelAccess.super_ConstPixelBufferAccess.m_size.m_data[1])) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,(char *)0x0,
                   "level.getWidth() == refLevelAccess.getWidth() && level.getHeight() == refLevelAccess.getHeight()"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
                   ,0x1ab);
        goto LAB_008c64ff;
      }
      tcu::CompressedTexture::decompress(this_01,&refLevelAccess,decompressionParams);
      pcVar1 = *(code **)(lVar6 + 0x288);
      dVar5 = getGLCubeFace((CubeFace)lVar11);
      puVar2 = (this_01->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      (*pcVar1)(dVar5,uVar10 & 0xffffffff,dVar4,this_01->m_width,this_01->m_height,0,
                *(int *)&(this_01->m_data).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish - (int)puVar2,puVar2);
      uVar12 = uVar12 + 0x100000000;
      pvVar9 = pvVar9 + 1;
    }
    uVar10 = uVar10 + 1;
    uVar7 = uVar7 + 0x600000000;
  } while( true );
}

Assistant:

void TextureCube::loadCompressed (int numLevels, const tcu::CompressedTexture* levels, const tcu::TexDecompressionParams& decompressionParams)
{
	const glw::Functions&	gl					= m_context.getFunctions();
	deUint32				compressedFormat	= getGLFormat(levels[0].getFormat());

	TCU_CHECK(m_glTexture);
	gl.bindTexture(GL_TEXTURE_CUBE_MAP, m_glTexture);

	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
		{
			const tcu::CompressedTexture& level = levels[levelNdx*tcu::CUBEFACE_LAST + face];

			// Decompress to reference texture.
			m_refTexture.allocLevel((tcu::CubeFace)face, levelNdx);
			tcu::PixelBufferAccess refLevelAccess = m_refTexture.getLevelFace(levelNdx, (tcu::CubeFace)face);
			TCU_CHECK(level.getWidth()	== refLevelAccess.getWidth() &&
					  level.getHeight()	== refLevelAccess.getHeight());
			level.decompress(refLevelAccess, decompressionParams);

			// Upload to GL texture in compressed form.
			gl.compressedTexImage2D(getGLCubeFace((tcu::CubeFace)face), levelNdx, compressedFormat,
									level.getWidth(), level.getHeight(), 0 /* border */, level.getDataSize(), level.getData());
		}
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Texture upload failed");
}